

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

void karma(int ip,int iq,double *phi,double *theta,double *A,double *P,double *V,int N,double *W,
          double *resid,double *sumlog,double *ssq,int iupd,double delta,int *iter,int *nit)

{
  double dVar1;
  void *__ptr;
  double dVar2;
  double dVar3;
  double dVar4;
  double *E;
  double et;
  double g;
  double ut;
  double ft;
  double A1;
  double dt;
  double wnext;
  int indw;
  int ii;
  int l;
  int indn;
  int ind;
  int swtch;
  int inde;
  int ir1;
  int j;
  int i;
  int np;
  int ir;
  double delta_local;
  double *P_local;
  double *A_local;
  double *theta_local;
  double *phi_local;
  int iq_local;
  int ip_local;
  
  i = iq + 1;
  *iter = 0;
  if (i < ip) {
    i = ip;
  }
  __ptr = malloc((long)i << 3);
  for (ir1 = 0; ir1 < i; ir1 = ir1 + 1) {
    *(undefined8 *)((long)__ptr + (long)ir1 * 8) = 0;
  }
  ind = 0;
  if (*nit == 0) {
    for (ir1 = 0; ir1 < N; ir1 = ir1 + 1) {
      dVar4 = W[ir1];
      if ((iupd != 1) || (0 < ir1)) {
        dVar2 = *A;
        if (i != 1) {
          for (inde = 0; inde < i + -1; inde = inde + 1) {
            A[inde] = A[inde + 1];
          }
        }
        A[i + -1] = 0.0;
        if (ip != 0) {
          for (inde = 0; inde < ip; inde = inde + 1) {
            A[inde] = phi[inde] * dVar2 + A[inde];
          }
        }
        l = -1;
        ii = i + -1;
        for (indw = 0; indw < i; indw = indw + 1) {
          for (inde = indw; inde < i; inde = inde + 1) {
            l = l + 1;
            P[l] = V[l];
            if (inde != i + -1) {
              ii = ii + 1;
              P[l] = P[ii] + P[l];
            }
          }
        }
      }
      dVar2 = ABS(*P);
      dVar3 = dVar4 - *A;
      if (i != 1) {
        l = i;
        for (inde = 1; inde < i; inde = inde + 1) {
          dVar1 = P[inde];
          A[inde] = (dVar1 / dVar2) * dVar3 + A[inde];
          for (indw = inde; indw < i; indw = indw + 1) {
            P[l] = -(dVar1 / dVar2) * P[indw] + P[l];
            l = l + 1;
          }
        }
      }
      *A = dVar4;
      for (indw = 0; indw < i; indw = indw + 1) {
        P[indw] = 0.0;
      }
      dVar4 = sqrt(dVar2);
      resid[ir1] = dVar3 / dVar4;
      *(double *)((long)__ptr + (long)ind * 8) = resid[ir1];
      ind = ind + 1;
      if (iq <= ind) {
        ind = 0;
      }
      *ssq = (dVar3 * dVar3) / dVar2 + *ssq;
      dVar4 = log(dVar2);
      *sumlog = dVar4 + *sumlog;
      *iter = *iter + 1;
    }
    *nit = N;
  }
  else {
    *nit = 0;
    for (wnext._4_4_ = 0; wnext._4_4_ < N; wnext._4_4_ = wnext._4_4_ + 1) {
      E = (double *)W[wnext._4_4_];
      wnext._0_4_ = wnext._4_4_;
      if (ip != 0) {
        for (inde = 0; inde < ip; inde = inde + 1) {
          wnext._0_4_ = wnext._0_4_ + -1;
          if (-1 < wnext._0_4_) {
            E = (double *)(-phi[inde] * W[wnext._0_4_] + (double)E);
          }
        }
      }
      if (iq != 0) {
        while (0 < iq) {
          ind = ind + -1;
          if (ind == -1) {
            ind = iq + -1;
          }
          E = (double *)(-*theta * *(double *)((long)__ptr + (long)ind * 8) + (double)E);
        }
      }
      *(double **)((long)__ptr + (long)ind * 8) = E;
      resid[wnext._4_4_] = (double)E;
      *ssq = (double)E * (double)E + *ssq;
      *iter = *iter + 1;
      ind = ind + 1;
      if (iq <= ind) {
        ind = 0;
      }
    }
  }
  if (*iter == 0) {
    *iter = 1;
  }
  free(__ptr);
  return;
}

Assistant:

void karma(int ip,int iq,double *phi,double *theta,double *A,double *P,double*V,int N,
	double *W,double *resid,double *sumlog,double *ssq,int iupd,double delta,int *iter,int *nit) {
	int ir,np,i,j,ir1,inde,swtch,ind,indn,l,ii,indw;
	double wnext,dt,A1,ft,ut,g,et;
	double *E;

	ir = iq + 1;
	swtch = 0;
	*iter = 0;

	if (ir < ip) {
		ir = ip;
	}
	E = (double*)malloc(sizeof(double)* ir);
	np = (ir * (ir + 1)) / 2;

	ir1 = ir - 1;
	for (i = 0; i < ir; ++i) {
		E[i] = 0.0;
	}
	inde = 0;

	if (*nit == 0) {
		for (i = 0; i < N; ++i) {//500
			wnext = W[i];
			if (iupd != 1 || i > 0) {//300
				dt = 0.0;
				if (ir != 1) {
					dt = P[ir];
				}
				/*
				if (dt < delta) {
					swtch = 1;
					*nit = i + 1;
					break;//610
				}
				*/
				A1 = A[0];
				if (ir != 1) {//110
					for (j = 0; j < ir1; ++j) {
						A[j] = A[j + 1];
					}
				}//110
				A[ir - 1] = 0.0;
				if (ip != 0) {//200
					for (j = 0; j < ip; ++j) {
						A[j] += phi[j] * A1;
					}
				}//200
				ind = -1;
				indn = ir-1;
				for (l = 0; l < ir; ++l) {
					for (j = l; j < ir; ++j) {
						ind++;
						P[ind] = V[ind];
						if (j != (ir - 1)) {
							indn++;
							P[ind] += P[indn];
						}
					}
				}
			}//300
			ft = fabs(P[0]);//modification
			ut = wnext - A[0];
			if (ir != 1) {//410
				ind = ir;
				for (j = 1; j < ir; ++j) {
					g = P[j] / ft;
					A[j] += g*ut;
					for (l = j; l < ir; ++l) {
						P[ind] -= g*P[l];
						ind++;
					}
				}
			}//410
			A[0] = wnext;
			for (l = 0; l < ir; ++l) {
				P[l] = 0.0;
			}
			resid[i] = ut / sqrt(ft);
			E[inde] = resid[i];
			inde++;
			if (inde >= iq) {
				inde = 0;
			}
			*ssq += (ut*ut) / ft;
			*sumlog += log(ft);// alog
			*iter = *iter + 1;;
			//printf(" sl %g", *sumlog);


		}//500
		if (swtch == 0) {
			*nit = N;
		}
	}
	else {
		i = 0;
		*nit = i;
		for (ii = i; ii < N; ++ii) {//650
			et = W[ii];
			indw = ii;
			if (ip != 0) {//630
				for (j = 0; j < ip; ++j) {
					indw--;
					if (indw >= 0) {
						et -= phi[j] * W[indw];
					}
				}
			}//630
			if (iq != 0) {//645
				for (j = 0; j < iq; ++i) {
					inde--;
					if (inde == -1) {
						inde = iq-1;
					}
					et -= theta[j] * E[inde];
				}
			}//645
			E[inde] = et;
			resid[ii] = et;
			*ssq += et*et;
			*iter = *iter + 1;
			inde++;
			if (inde >= iq) {
				inde = 0;
			}
		}//650

	}
	if (*iter == 0) {
		*iter = 1;
	}
	free(E);
}